

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_serialize_fromfile(FILE *in)

{
  uint8_t uVar1;
  uint32_t value;
  size_t sVar2;
  uint64_t uVar3;
  MDD ifneq;
  undefined1 local_50 [8];
  lddmc_ser s;
  MDD down;
  MDD right;
  mddnode node;
  size_t i;
  size_t count;
  FILE *in_local;
  
  count = (size_t)in;
  sVar2 = fread(&i,8,1,(FILE *)in);
  if (sVar2 != 1) {
    printf("sylvan_serialize_fromfile: file format error, giving up\n");
    exit(-1);
  }
  node.b = 1;
  while( true ) {
    if (i < node.b) {
      return;
    }
    sVar2 = fread(&right,0x10,1,(FILE *)count);
    if (sVar2 != 1) {
      printf("sylvan_serialize_fromfile: file format error, giving up\n");
      exit(-1);
    }
    uVar3 = mddnode_getright((mddnode_t)&right);
    if (lddmc_ser_done + 1 < uVar3) {
      __assert_fail("mddnode_getright(&node) <= lddmc_ser_done+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0xa29,"void lddmc_serialize_fromfile(FILE *)");
    }
    uVar3 = mddnode_getdown((mddnode_t)&right);
    if (lddmc_ser_done + 1 < uVar3) break;
    uVar3 = mddnode_getright((mddnode_t)&right);
    ifneq = lddmc_serialize_get_reversed(uVar3);
    uVar3 = mddnode_getdown((mddnode_t)&right);
    s.assigned = lddmc_serialize_get_reversed(uVar3);
    uVar1 = mddnode_getcopy((mddnode_t)&right);
    if (uVar1 == '\0') {
      value = mddnode_getvalue((mddnode_t)&right);
      local_50 = (undefined1  [8])lddmc_makenode(value,s.assigned,ifneq);
    }
    else {
      local_50 = (undefined1  [8])lddmc_make_copynode(s.assigned,ifneq);
    }
    s.mdd = lddmc_ser_done + 2;
    lddmc_ser_done = lddmc_ser_done + 1;
    lddmc_ser_insert(&lddmc_ser_set,(lddmc_ser *)local_50);
    lddmc_ser_reversed_insert(&lddmc_ser_reversed_set,(lddmc_ser *)local_50);
    node.b = node.b + 1;
  }
  __assert_fail("mddnode_getdown(&node) <= lddmc_ser_done+1",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                ,0xa2a,"void lddmc_serialize_fromfile(FILE *)");
}

Assistant:

void
lddmc_serialize_fromfile(FILE *in)
{
    size_t count, i;
    if (fread(&count, sizeof(size_t), 1, in) != 1) {
        // TODO FIXME return error
        printf("sylvan_serialize_fromfile: file format error, giving up\n");
        exit(-1);
    }

    for (i=1; i<=count; i++) {
        struct mddnode node;
        if (fread(&node, sizeof(struct mddnode), 1, in) != 1) {
            // TODO FIXME return error
            printf("sylvan_serialize_fromfile: file format error, giving up\n");
            exit(-1);
        }

        assert(mddnode_getright(&node) <= lddmc_ser_done+1);
        assert(mddnode_getdown(&node) <= lddmc_ser_done+1);

        MDD right = lddmc_serialize_get_reversed(mddnode_getright(&node));
        MDD down = lddmc_serialize_get_reversed(mddnode_getdown(&node));

        struct lddmc_ser s;
        if (mddnode_getcopy(&node)) s.mdd = lddmc_make_copynode(down, right);
        else s.mdd = lddmc_makenode(mddnode_getvalue(&node), down, right);
        s.assigned = lddmc_ser_done+2; // starts at 0 but we want 2-based...
        lddmc_ser_done++;

        lddmc_ser_insert(&lddmc_ser_set, &s);
        lddmc_ser_reversed_insert(&lddmc_ser_reversed_set, &s);
    }
}